

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initkbd.c
# Opt level: O2

void keyboardtype(int fd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  IFPAGE *pIVar4;
  byte bVar5;
  int iVar6;
  byte *__s2;
  u_char *puVar7;
  long lVar8;
  int i;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  DLword DVar12;
  int *piVar13;
  int *piVar14;
  uint uVar15;
  ulong uVar16;
  int local_434;
  int minkey;
  int symspercode;
  int lisp_codes_used [256];
  
  pIVar4 = InterfacePage;
  uVar1 = InterfacePage->devconfig;
  uVar11 = uVar1 & 0xfff8;
  InterfacePage->devconfig = uVar11;
  __s2 = (byte *)getenv("LDEKBDTYPE");
  if (__s2 == (byte *)0x0) goto LAB_00121e50;
  iVar6 = strcmp("as3000j",(char *)__s2);
  if (iVar6 == 0) {
    SUNLispKeyMap = SUNLispKeyMap_for4;
    pIVar4->devconfig = uVar1 | 7;
    return;
  }
  iVar6 = strcmp("type4",(char *)__s2);
  if (iVar6 != 0) {
    iVar6 = strcmp("type2",(char *)__s2);
    if (iVar6 != 0) {
      iVar6 = strcmp("jle",(char *)__s2);
      if (iVar6 == 0) {
        SUNLispKeyMap = SUNLispKeyMap_jle;
        DVar12 = uVar11 | 2;
        goto LAB_00121fb9;
      }
      if (*__s2 == 0x58) {
        if (__s2[1] == 0) {
LAB_00121e50:
          puVar7 = (u_char *)malloc(0x100);
          for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
            lisp_codes_used[lVar8] = 0;
            puVar7[lVar8] = 0xff;
          }
          XDisplayKeycodes(currentdsp->display_id,&minkey,&local_434);
          iVar6 = (local_434 - minkey) + 1;
          lVar8 = XGetKeyboardMapping(currentdsp->display_id,minkey & 0xff,iVar6,&symspercode);
          uVar15 = iVar6 * symspercode;
          uVar9 = 0;
          uVar16 = (ulong)uVar15;
          if ((int)uVar15 < 1) {
            uVar16 = uVar9;
          }
          piVar14 = generic_X_keymap;
          iVar6 = -1;
LAB_00121ee8:
          do {
            do {
              piVar13 = piVar14;
              if (*piVar13 == -1) {
                XFree();
                SUNLispKeyMap = puVar7;
                XGenericKeyMap = puVar7;
                return;
              }
              iVar2 = piVar13[2];
              piVar14 = piVar13 + 3;
              bVar5 = (byte)uVar9;
              uVar9 = 1;
            } while ((bVar5 & iVar2 == iVar6) != 0);
            iVar3 = piVar13[1];
            for (uVar9 = 0; iVar6 = iVar2, uVar16 != uVar9; uVar9 = uVar9 + 1) {
              if ((*(long *)(lVar8 + uVar9 * 8) == (long)iVar2) &&
                 (lVar10 = (long)(int)((long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 |
                                             uVar9 & 0xffffffff) / (long)symspercode) + (long)minkey
                 , puVar7[lVar10 + -7] == 0xff)) {
                uVar9 = 0;
                if (((int)lVar10 != 0) &&
                   ((*piVar13 != 0 || (uVar9 = 0, lisp_codes_used[iVar3] == 0)))) {
                  lisp_codes_used[iVar3] = 1;
                  puVar7[lVar10 + -7] = (u_char)iVar3;
                  uVar9 = 1;
                }
                goto LAB_00121ee8;
              }
            }
            uVar9 = 0;
          } while( true );
        }
      }
      else {
        uVar15 = *__s2 - 0x78;
        if (uVar15 == 0) {
          uVar15 = (uint)__s2[1];
        }
        if (uVar15 == 0) goto LAB_00121e50;
      }
      iVar6 = strcmp("sdl",(char *)__s2);
      if (iVar6 == 0) {
        sprintf((char *)lisp_codes_used,"Unsupported keyboard type: %d",0x10);
        puts((char *)lisp_codes_used);
        puts("Configuring keyboard for type-3");
      }
    }
    SUNLispKeyMap = SUNLispKeyMap_for3;
    return;
  }
  SUNLispKeyMap = SUNLispKeyMap_for4;
  DVar12 = uVar11 | 1;
LAB_00121fb9:
  pIVar4->devconfig = DVar12;
  return;
}

Assistant:

void keyboardtype(int fd)
{
  int type;
  int i;
  char *key;

#if defined(OS4)
  for (i = 0; i < 5000; i++) { /* IDLE LOOP */
  }                            /* because of a SunOS bug */
#endif

  /* clear the keyboard field in devconfig */
  InterfacePage->devconfig &= 0xfff8;

  /************************************************************
   Due to the problems of SunOS 4.0 & 4.0.1
   calling ioctl never return the correct keyboard type.
   So,these 2 lines are commented out ...(Take)->AR11100
  *************************************************************/

  /* Get keytype from LDEKBDTYPE  */
  if ((key = getenv("LDEKBDTYPE")) == 0) {
#ifdef XWINDOW
    type = KB_X;
#elif DOS
    type = KB_DOS;
#elif SDL
    type = KB_SDL;
#endif /* XWINDOW */
  } /* if end */
  else {
    if (strcmp("as3000j", key) == 0)
      type = KB_AS3000J;
    else if (strcmp("type4", key) == 0)
      type = KB_SUN4;
    else if (strcmp("type2", key) == 0)
      type = KB_SUN2;
    else if (strcmp("jle", key) == 0)
      type = KB_JLE;
    else if (strcmp("X", key) == 0 || strcmp("x", key) == 0)
      type = KB_X;
    else if (strcmp("sdl", key) == 0)
      type = KB_SDL;
    else
      type = KB_SUN3; /* default */
  }

  switch (type) {
    case KB_SUN2: /* type2, we still use keymap for type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      /* MIN_KEYTYPE is 3,so we can't set devconfig correctly */
      /* Therefore type2 may treat as type3 */
      InterfacePage->devconfig |= 0;
      break;
    case KB_SUN3: /* type3 */
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_SUN4: /* type4 */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      break;
    case KB_JLE: /* JLE */
      /*printf("jle\n"); */
      SUNLispKeyMap = SUNLispKeyMap_jle;
      InterfacePage->devconfig |= type - MIN_KEYTYPE;
      /* InterfacePage->devconfig |= 4-MIN_KEYTYPE; */
      break;
    case KB_AS3000J: /* for AS, use type4 map */
      SUNLispKeyMap = SUNLispKeyMap_for4;
      InterfacePage->devconfig |= type - MIN_KEYTYPE; /* 7 */
      break;
#ifdef XWINDOW
    case KB_X:
      XGenericKeyMap = (u_char *)make_X_keymap();
      SUNLispKeyMap = XGenericKeyMap;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* XWINDOW */
#ifdef SDL
  case KB_SDL:
    InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
    break;
#endif /* SDL */
#ifdef DOS
    case KB_DOS:
      SUNLispKeyMap = DOSLispKeyMap_101;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE; /* 10 */
      break;
#endif /* DOS */
    default: {
      char errmsg[200];
      sprintf(errmsg, "Unsupported keyboard type: %d", type);
      printf("%s\n", errmsg);
      printf("Configuring keyboard for type-3\n");
      SUNLispKeyMap = SUNLispKeyMap_for3;
      InterfacePage->devconfig |= KB_SUN3 - MIN_KEYTYPE;
      break;
    }
  }

}